

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O0

shared_ptr<nigel::AstFunction> __thiscall nigel::AstExpr::as<nigel::AstFunction>(AstExpr *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nigel::AstFunction> sVar1;
  enable_shared_from_this<nigel::AstExpr> local_28;
  AstExpr *this_local;
  
  this_local = this;
  std::enable_shared_from_this<nigel::AstExpr>::shared_from_this(&local_28);
  std::static_pointer_cast<nigel::AstFunction,nigel::AstExpr>((shared_ptr<nigel::AstExpr> *)this);
  std::shared_ptr<nigel::AstExpr>::~shared_ptr((shared_ptr<nigel::AstExpr> *)&local_28);
  sVar1.super___shared_ptr<nigel::AstFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<nigel::AstFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<nigel::AstFunction>)
         sVar1.super___shared_ptr<nigel::AstFunction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as()
		{
			return std::static_pointer_cast< T >( shared_from_this() );
		}